

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int __thiscall
CTcSymLocalBase::apply_ctx_var_conv
          (CTcSymLocalBase *this,CTcPrsSymtab *symtab,CTPNCodeBody *code_body)

{
  int iVar1;
  int iVar2;
  undefined8 in_RDX;
  CTPNCodeBodyBase *in_RSI;
  CTcSymLocalBase *in_RDI;
  CTcSymLocal *pCVar3;
  undefined4 in_stack_ffffffffffffffd0;
  int local_4;
  
  iVar2 = (int)((ulong)in_RDX >> 0x20);
  if ((*(ushort *)&in_RDI->field_0x64 >> 8 & 1) == 0) {
    (*(in_RSI->super_CTPNStmTop).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.
      super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[4])(in_RSI,in_RDI);
    local_4 = 0;
  }
  else if (in_RDI->ctx_orig_ == (CTcSymLocal *)0x0) {
    local_4 = 0;
  }
  else {
    pCVar3 = in_RDI->ctx_orig_;
    iVar1 = get_val_used(in_RDI);
    get_val_assigned(in_RDI);
    convert_to_ctx_var((CTcSymLocalBase *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                       (int)((ulong)pCVar3 >> 0x20),(int)pCVar3);
    iVar2 = CTPNCodeBodyBase::get_or_add_ctx_var_for_level(in_RSI,iVar2);
    in_RDI->ctx_var_num_ = iVar2;
    *(ushort *)&in_RDI->field_0x64 = *(ushort *)&in_RDI->field_0x64 & 0xffdf | 0x20;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CTcSymLocalBase::apply_ctx_var_conv(
    CTcPrsSymtab *symtab, CTPNCodeBody *code_body)
{
    /* 
     *   if this symbol isn't referenced, simply delete it from the table,
     *   so that it doesn't get entered in the debug records; and there's
     *   no need to propagate it back to the enclosing scope as a context
     *   variable, since it's not referenced from this enclosed scope 
     */
    if (!referenced_)
    {
        /* remove the symbol from the table */
        symtab->remove_entry(this);

        /* this variable doesn't need to be converted */
        return FALSE;
    }

    /* 
     *   convert the symbol in the enclosing scope to a context local, if
     *   it's not already 
     */
    if (ctx_orig_ != 0)
    {
        /* convert the original to a context symbol */
        ctx_orig_->convert_to_ctx_var(get_val_used(), get_val_assigned());

        /* 
         *   ask the code body for the context object's local variable for
         *   our recursion level 
         */
        ctx_var_num_ = code_body->get_or_add_ctx_var_for_level(ctx_level_);

        /* note that we've set our context variable ID */
        ctx_var_num_set_ = TRUE;

        /* this variable was converted */
        return TRUE;
    }

    /* this variable wasn't converted */
    return FALSE;
}